

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECI.cpp
# Opt level: O2

string * __thiscall ZXing::ToString_abi_cxx11_(string *__return_storage_ptr__,ZXing *this,ECI eci)

{
  int in_ECX;
  string local_30;
  
  ToString<int,void>(&local_30,this,6,in_ECX);
  std::operator+(__return_storage_ptr__,'\\',&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(ECI eci)
{
	return '\\' + ToString(ToInt(eci), 6);
}